

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar9;
  ushort uVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint extraout_EAX;
  long lVar32;
  int family;
  int family_00;
  int sock;
  int sock_00;
  int family_01;
  int family_02;
  int sock_01;
  int sock_02;
  char *pcVar33;
  char **unaff_R15;
  undefined1 auVar34 [16];
  uint uVar36;
  int iVar37;
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uint uVar40;
  int iVar43;
  undefined1 auVar41 [14];
  int iVar45;
  undefined1 auVar46 [16];
  uint uVar47;
  uint uVar48;
  undefined1 auVar49 [14];
  int iVar53;
  undefined1 auVar50 [16];
  int iVar55;
  undefined1 auVar51 [16];
  int iVar56;
  uint uVar57;
  int iVar59;
  undefined1 auVar58 [16];
  int iVar61;
  uchar *buf2;
  uchar *buf1;
  nn_iovec iov;
  char socket_address_tcp [128];
  char *local_e8;
  char *local_e0;
  char **local_d8;
  undefined8 local_d0;
  undefined8 **local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  char local_a8 [128];
  byte bVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  char cVar8;
  byte bVar10;
  char cVar11;
  char cVar12;
  byte bVar13;
  byte bVar14;
  char cVar15;
  char cVar16;
  undefined1 auVar42 [16];
  int iVar44;
  undefined1 auVar52 [16];
  int iVar54;
  int iVar60;
  
  if (argc < 2) {
    pcVar33 = "5555";
  }
  else {
    pcVar33 = argv[1];
  }
  uVar28 = atoi(pcVar33);
  iVar30 = 0x103259;
  pcVar33 = "127.0.0.1";
  sprintf(local_a8,"%s://%s:%d","tcp","127.0.0.1",(ulong)uVar28);
  iVar29 = test_socket_impl((char *)0x32,iVar30,family,(int)pcVar33);
  iVar30 = iVar29;
  test_bind_impl((char *)0x33,iVar29,0x103198,pcVar33);
  iVar30 = test_socket_impl((char *)0x34,iVar30,family_00,(int)pcVar33);
  test_connect_impl((char *)0x35,iVar30,0x103198,pcVar33);
  local_e0 = (char *)nn_allocmsg(0x100,0);
  if (local_e0 == (char *)0x0) goto LAB_00102155;
  lVar32 = 0;
  do {
    local_e0[lVar32] = (char)lVar32;
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x100);
  unaff_R15 = &local_e0;
  iVar31 = nn_send(iVar30,unaff_R15,0xffffffffffffffff,0);
  if (iVar31 < 0) goto LAB_0010215a;
  if (iVar31 != 0x100) goto LAB_0010215f;
  local_e8 = (char *)0x0;
  iVar31 = nn_recv(iVar29,&local_e8,0xffffffffffffffff,0);
  if (iVar31 < 0) goto LAB_00102164;
  if (iVar31 != 0x100) goto LAB_00102169;
  if (local_e8 == (char *)0x0) goto LAB_0010216e;
  lVar32 = 0;
  do {
    if ((char)lVar32 != local_e8[lVar32]) {
      main_cold_3();
      goto LAB_0010214b;
    }
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x100);
  iVar31 = nn_freemsg();
  if (iVar31 != 0) goto LAB_00102173;
  pcVar33 = (char *)nn_allocmsg(0x100,0);
  local_e0 = pcVar33;
  if (pcVar33 == (char *)0x0) goto LAB_00102178;
  lVar32 = 0;
  do {
    pcVar33[lVar32] = (char)lVar32;
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x100);
  local_d0 = 0xffffffffffffffff;
  uStack_b8 = 0;
  local_b0 = 0;
  local_c0 = 1;
  local_d8 = unaff_R15;
  local_c8 = &local_d8;
  iVar31 = nn_sendmsg(iVar30,&local_c8,0);
  if (iVar31 < 0) goto LAB_0010217d;
  if (iVar31 != 0x100) goto LAB_00102182;
  local_e8 = (char *)0x0;
  local_d0 = 0xffffffffffffffff;
  uStack_b8 = 0;
  local_b0 = 0;
  local_c0 = 1;
  local_d8 = &local_e8;
  local_c8 = &local_d8;
  iVar31 = nn_recvmsg(iVar29,&local_c8,0);
  if (iVar31 < 0) goto LAB_00102187;
  if (iVar31 != 0x100) goto LAB_0010218c;
  if (local_e8 == (char *)0x0) goto LAB_00102191;
  lVar32 = 0;
  do {
    if ((char)lVar32 != local_e8[lVar32]) goto LAB_0010214b;
    lVar32 = lVar32 + 1;
  } while (lVar32 != 0x100);
  iVar31 = nn_freemsg();
  if (iVar31 != 0) goto LAB_00102196;
  test_close_impl((char *)0x65,iVar30,sock);
  test_close_impl((char *)0x66,iVar29,sock_00);
  iVar29 = test_socket_impl((char *)0x6a,iVar29,family_01,(int)pcVar33);
  iVar30 = iVar29;
  test_bind_impl((char *)0x6b,iVar29,(int)local_a8,pcVar33);
  iVar30 = test_socket_impl((char *)0x6c,iVar30,family_02,(int)pcVar33);
  test_connect_impl((char *)0x6d,iVar30,(int)local_a8,pcVar33);
  lVar32 = 0;
  auVar34 = _DAT_00103010;
  auVar35 = _DAT_00103020;
  auVar38 = _DAT_00103030;
  auVar39 = _DAT_00103040;
  do {
    uVar36 = auVar35._4_4_;
    iVar37 = auVar35._12_4_;
    auVar46._4_4_ = uVar36;
    auVar46._0_4_ = uVar36;
    auVar46._8_4_ = iVar37;
    auVar46._12_4_ = iVar37;
    uVar40 = auVar35._0_4_ % 10;
    iVar44 = auVar35._8_4_;
    iVar43 = iVar44 - (int)(((auVar35._8_8_ & 0xffffffff) / 10) * 10);
    iVar45 = iVar37 - (int)(((auVar46._8_8_ & 0xffffffff) / 10) * 10);
    uVar28 = auVar34._4_4_;
    iVar31 = auVar34._12_4_;
    auVar50._4_4_ = uVar28;
    auVar50._0_4_ = uVar28;
    auVar50._8_4_ = iVar31;
    auVar50._12_4_ = iVar31;
    uVar47 = auVar34._0_4_ % 10;
    iVar54 = auVar34._8_4_;
    iVar53 = iVar54 - (int)(((auVar34._8_8_ & 0xffffffff) / 10) * 10);
    iVar55 = iVar31 - (int)(((auVar50._8_8_ & 0xffffffff) / 10) * 10);
    uVar17 = (ushort)uVar40;
    bVar1 = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar40 - (0xff < uVar17);
    uVar17 = (ushort)(uVar36 % 10);
    bVar2 = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uVar36 % 10) - (0xff < uVar17);
    sVar18 = (short)iVar43;
    cVar3 = (0 < sVar18) * (sVar18 < 0x100) * (char)iVar43 - (0xff < sVar18);
    sVar18 = (short)((uint)iVar43 >> 0x10);
    sVar24 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * (char)((uint)iVar43 >> 0x10) -
                      (0xff < sVar18),cVar3);
    sVar18 = (short)iVar45;
    cVar4 = (0 < sVar18) * (sVar18 < 0x100) * (char)iVar45 - (0xff < sVar18);
    sVar18 = (short)((uint)iVar45 >> 0x10);
    uVar26 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * (char)((uint)iVar45 >> 0x10) -
                      (0xff < sVar18),CONCAT12(cVar4,sVar24));
    uVar17 = (ushort)uVar47;
    bVar5 = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar47 - (0xff < uVar17);
    auVar41._0_10_ = (unkuint10)CONCAT14(bVar5,uVar26) << 0x20;
    uVar17 = (ushort)(uVar28 % 10);
    bVar6 = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uVar28 % 10) - (0xff < uVar17);
    auVar41[10] = bVar6;
    auVar41[0xb] = 0;
    sVar18 = (short)iVar53;
    cVar7 = (0 < sVar18) * (sVar18 < 0x100) * (char)iVar53 - (0xff < sVar18);
    auVar41[0xc] = cVar7;
    sVar18 = (short)((uint)iVar53 >> 0x10);
    auVar41[0xd] = (0 < sVar18) * (sVar18 < 0x100) * (char)((uint)iVar53 >> 0x10) - (0xff < sVar18);
    sVar18 = (short)iVar55;
    cVar8 = (0 < sVar18) * (sVar18 < 0x100) * (char)iVar55 - (0xff < sVar18);
    auVar42[0xe] = cVar8;
    auVar42._0_14_ = auVar41;
    sVar18 = (short)((uint)iVar55 >> 0x10);
    auVar42[0xf] = (0 < sVar18) * (sVar18 < 0x100) * (char)((uint)iVar55 >> 0x10) - (0xff < sVar18);
    uVar47 = auVar39._4_4_;
    iVar45 = auVar39._12_4_;
    auVar51._4_4_ = uVar47;
    auVar51._0_4_ = uVar47;
    auVar51._8_4_ = iVar45;
    auVar51._12_4_ = iVar45;
    uVar48 = auVar39._0_4_ % 10;
    iVar53 = auVar39._8_4_;
    iVar55 = iVar53 - (int)(((auVar39._8_8_ & 0xffffffff) / 10) * 10);
    iVar56 = iVar45 - (int)(((auVar51._8_8_ & 0xffffffff) / 10) * 10);
    uVar40 = auVar38._4_4_;
    iVar43 = auVar38._12_4_;
    auVar58._4_4_ = uVar40;
    auVar58._0_4_ = uVar40;
    auVar58._8_4_ = iVar43;
    auVar58._12_4_ = iVar43;
    uVar57 = auVar38._0_4_ % 10;
    iVar60 = auVar38._8_4_;
    iVar59 = iVar60 - (int)(((auVar38._8_8_ & 0xffffffff) / 10) * 10);
    iVar61 = iVar43 - (int)(((auVar58._8_8_ & 0xffffffff) / 10) * 10);
    uVar17 = (ushort)uVar48;
    bVar9 = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar48 - (0xff < uVar17);
    uVar17 = (ushort)(uVar47 % 10);
    bVar10 = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uVar47 % 10) - (0xff < uVar17);
    sVar18 = (short)iVar55;
    cVar11 = (0 < sVar18) * (sVar18 < 0x100) * (char)iVar55 - (0xff < sVar18);
    sVar18 = (short)((uint)iVar55 >> 0x10);
    sVar25 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * (char)((uint)iVar55 >> 0x10) -
                      (0xff < sVar18),cVar11);
    sVar18 = (short)iVar56;
    cVar12 = (0 < sVar18) * (sVar18 < 0x100) * (char)iVar56 - (0xff < sVar18);
    sVar18 = (short)((uint)iVar56 >> 0x10);
    uVar27 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * (char)((uint)iVar56 >> 0x10) -
                      (0xff < sVar18),CONCAT12(cVar12,sVar25));
    uVar17 = (ushort)uVar57;
    bVar13 = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar57 - (0xff < uVar17);
    auVar49._0_10_ = (unkuint10)CONCAT14(bVar13,uVar27) << 0x20;
    uVar17 = (ushort)(uVar40 % 10);
    bVar14 = (uVar17 != 0) * (uVar17 < 0x100) * (char)(uVar40 % 10) - (0xff < uVar17);
    auVar49[10] = bVar14;
    auVar49[0xb] = 0;
    sVar18 = (short)iVar59;
    cVar15 = (0 < sVar18) * (sVar18 < 0x100) * (char)iVar59 - (0xff < sVar18);
    auVar49[0xc] = cVar15;
    sVar18 = (short)((uint)iVar59 >> 0x10);
    auVar49[0xd] = (0 < sVar18) * (sVar18 < 0x100) * (char)((uint)iVar59 >> 0x10) - (0xff < sVar18);
    sVar18 = (short)iVar61;
    cVar16 = (0 < sVar18) * (sVar18 < 0x100) * (char)iVar61 - (0xff < sVar18);
    auVar52[0xe] = cVar16;
    auVar52._0_14_ = auVar49;
    sVar18 = (short)((uint)iVar61 >> 0x10);
    auVar52[0xf] = (0 < sVar18) * (sVar18 < 0x100) * (char)((uint)iVar61 >> 0x10) - (0xff < sVar18);
    sVar18 = (short)((uint)uVar27 >> 0x10);
    sVar19 = auVar49._12_2_;
    sVar20 = auVar52._14_2_;
    sVar21 = (short)((uint)uVar26 >> 0x10);
    sVar22 = auVar41._12_2_;
    sVar23 = auVar42._14_2_;
    longdata[lVar32] = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9) | 0x30;
    longdata[lVar32 + 1] = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10) | 0x30;
    longdata[lVar32 + 2] = (0 < sVar25) * (sVar25 < 0x100) * cVar11 - (0xff < sVar25) | 0x30;
    longdata[lVar32 + 3] = (0 < sVar18) * (sVar18 < 0x100) * cVar12 - (0xff < sVar18) | 0x30;
    longdata[lVar32 + 4] = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13) | 0x30;
    longdata[lVar32 + 5] = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14) | 0x30;
    longdata[lVar32 + 6] = (0 < sVar19) * (sVar19 < 0x100) * cVar15 - (0xff < sVar19) | 0x30;
    longdata[lVar32 + 7] = (0 < sVar20) * (sVar20 < 0x100) * cVar16 - (0xff < sVar20) | 0x30;
    longdata[lVar32 + 8] = (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1) | 0x30;
    longdata[lVar32 + 9] = (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2) | 0x30;
    longdata[lVar32 + 10] = (0 < sVar24) * (sVar24 < 0x100) * cVar3 - (0xff < sVar24) | 0x30;
    longdata[lVar32 + 0xb] = (0 < sVar21) * (sVar21 < 0x100) * cVar4 - (0xff < sVar21) | 0x30;
    longdata[lVar32 + 0xc] = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5) | 0x30;
    longdata[lVar32 + 0xd] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6) | 0x30;
    longdata[lVar32 + 0xe] = (0 < sVar22) * (sVar22 < 0x100) * cVar7 - (0xff < sVar22) | 0x30;
    longdata[lVar32 + 0xf] = (0 < sVar23) * (sVar23 < 0x100) * cVar8 - (0xff < sVar23) | 0x30;
    lVar32 = lVar32 + 0x10;
    auVar39._0_4_ = auVar39._0_4_ + 0x10;
    auVar39._4_4_ = uVar47 + 0x10;
    auVar39._8_4_ = iVar53 + 0x10;
    auVar39._12_4_ = iVar45 + 0x10;
    auVar38._0_4_ = auVar38._0_4_ + 0x10;
    auVar38._4_4_ = uVar40 + 0x10;
    auVar38._8_4_ = iVar60 + 0x10;
    auVar38._12_4_ = iVar43 + 0x10;
    auVar35._0_4_ = auVar35._0_4_ + 0x10;
    auVar35._4_4_ = uVar36 + 0x10;
    auVar35._8_4_ = iVar44 + 0x10;
    auVar35._12_4_ = iVar37 + 0x10;
    auVar34._0_4_ = auVar34._0_4_ + 0x10;
    auVar34._4_4_ = uVar28 + 0x10;
    auVar34._8_4_ = iVar54 + 0x10;
    auVar34._12_4_ = iVar31 + 0x10;
  } while (lVar32 != 0x100000);
  longdata[0xfffff] = '\0';
  unaff_R15 = (char **)strlen(longdata);
  uVar28 = nn_send(iVar29,longdata,unaff_R15,0);
  if (-1 < (int)uVar28) {
    if (uVar28 != (uint)unaff_R15) goto LAB_001021c8;
    iVar31 = nn_recv(iVar30,&local_e8,0xffffffffffffffff,0);
    if (iVar31 < 0) goto LAB_0010219b;
    if (iVar31 != 0xfffff) goto LAB_001021a0;
    if (local_e8 == (char *)0x0) goto LAB_001021a5;
    lVar32 = 0;
    do {
      if ((uint)(byte)local_e8[lVar32] != (int)longdata[lVar32]) goto LAB_00102150;
      lVar32 = lVar32 + 1;
    } while (lVar32 != 0xfffff);
    iVar31 = nn_freemsg();
    if (iVar31 != 0) goto LAB_001021aa;
    test_close_impl((char *)0x7d,iVar30,sock_01);
    test_close_impl((char *)0x7e,iVar29,sock_02);
    local_e0 = (char *)nn_allocmsg(8,0);
    if (local_e0 == (char *)0x0) goto LAB_001021af;
    local_e8 = (char *)nn_reallocmsg(local_e0,1);
    if (local_e8 != local_e0) goto LAB_001021b4;
    local_e0 = (char *)nn_reallocmsg(local_e8,100);
    if (local_e0 == local_e8) goto LAB_001021b9;
    if (local_e0 != (char *)0x0) {
      nn_freemsg(local_e0);
      return 0;
    }
    goto LAB_001021be;
  }
  goto LAB_001021c3;
LAB_0010214b:
  main_cold_7();
LAB_00102150:
  main_cold_10();
LAB_00102155:
  main_cold_26();
LAB_0010215a:
  main_cold_25();
LAB_0010215f:
  main_cold_1();
LAB_00102164:
  main_cold_24();
LAB_00102169:
  main_cold_2();
LAB_0010216e:
  main_cold_23();
LAB_00102173:
  main_cold_4();
LAB_00102178:
  main_cold_22();
LAB_0010217d:
  main_cold_21();
LAB_00102182:
  main_cold_5();
LAB_00102187:
  main_cold_20();
LAB_0010218c:
  main_cold_6();
LAB_00102191:
  main_cold_19();
LAB_00102196:
  main_cold_8();
LAB_0010219b:
  main_cold_17();
LAB_001021a0:
  main_cold_9();
LAB_001021a5:
  main_cold_16();
LAB_001021aa:
  main_cold_11();
LAB_001021af:
  main_cold_15();
LAB_001021b4:
  main_cold_12();
LAB_001021b9:
  main_cold_14();
LAB_001021be:
  main_cold_13();
LAB_001021c3:
  main_cold_18();
  uVar28 = extraout_EAX;
LAB_001021c8:
  fprintf(_stderr,"Data to send is truncated: %d != %d (%s:%d)\n",(ulong)uVar28,
          (ulong)unaff_R15 & 0xffffffff,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x72);
  nn_err_abort();
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    unsigned char *buf1, *buf2;
    int i;
    struct nn_iovec iov;
    struct nn_msghdr hdr;
    char socket_address_tcp[128];

    test_addr_from(socket_address_tcp, "tcp", "127.0.0.1",
            get_test_port(argc, argv));

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    buf1 = nn_allocmsg (256, 0);
    alloc_assert (buf1);
    for (i = 0; i != 256; ++i)
        buf1 [i] = (unsigned char) i;
    rc = nn_send (sc, &buf1, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    buf2 = NULL;
    rc = nn_recv (sb, &buf2, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    nn_assert (buf2);
    for (i = 0; i != 256; ++i)
        nn_assert (buf2 [i] == (unsigned char) i);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    buf1 = nn_allocmsg (256, 0);
    alloc_assert (buf1);
    for (i = 0; i != 256; ++i)
        buf1 [i] = (unsigned char) i;
    iov.iov_base = &buf1;
    iov.iov_len = NN_MSG;
    memset (&hdr, 0, sizeof (hdr));
    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    rc = nn_sendmsg (sc, &hdr, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    buf2 = NULL;
    iov.iov_base = &buf2;
    iov.iov_len = NN_MSG;
    memset (&hdr, 0, sizeof (hdr));
    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    rc = nn_recvmsg (sb, &hdr, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    nn_assert (buf2);
    for (i = 0; i != 256; ++i)
        nn_assert (buf2 [i] == (unsigned char) i);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    test_close (sc);
    test_close (sb);

    /*  Test receiving of large message  */

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address_tcp);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address_tcp);

    for (i = 0; i < (int) sizeof (longdata); ++i)
        longdata[i] = '0' + (i % 10);
    longdata [sizeof (longdata) - 1] = 0;
    test_send (sb, longdata);

    rc = nn_recv (sc, &buf2, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == sizeof (longdata) - 1);
    nn_assert (buf2);
    for (i = 0; i < (int) sizeof (longdata) - 1; ++i)
        nn_assert (buf2 [i] == longdata [i]);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    test_close (sc);
    test_close (sb);


    /*  Test reallocmsg  */
    buf1 = nn_allocmsg (8, 0);
    alloc_assert (buf1);

    buf2 = nn_reallocmsg (buf1, 1);

    nn_assert (buf2 == buf1);

    buf1 = nn_reallocmsg (buf2, 100);
    nn_assert (buf1 != buf2);
    nn_assert (buf1 != 0);

    nn_freemsg (buf1);

    return 0;
}